

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pipeline_event.cpp
# Opt level: O0

void __thiscall
duckdb::BasePipelineEvent::BasePipelineEvent
          (BasePipelineEvent *this,shared_ptr<duckdb::Pipeline,_true> *pipeline_p)

{
  Executor *in_RSI;
  Event *in_RDI;
  
  shared_ptr<duckdb::Pipeline,_true>::operator->((shared_ptr<duckdb::Pipeline,_true> *)in_RDI);
  Event::Event(in_RDI,in_RSI);
  in_RDI->_vptr_Event = (_func_int **)&PTR__BasePipelineEvent_0350dff8;
  shared_ptr<duckdb::Pipeline,_true>::shared_ptr
            ((shared_ptr<duckdb::Pipeline,_true> *)in_RDI,
             (shared_ptr<duckdb::Pipeline,_true> *)in_RSI);
  return;
}

Assistant:

BasePipelineEvent::BasePipelineEvent(shared_ptr<Pipeline> pipeline_p)
    : Event(pipeline_p->executor), pipeline(std::move(pipeline_p)) {
}